

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O3

void HSendPacket(int node,int len)

{
  PacketStore *pPVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int *piVar13;
  uint uVar14;
  undefined1 local_36f8 [14024];
  
  uVar12 = (ulong)(uint)len;
  if (node != 0 && debugfile != (FILE *)0x0) {
    if ((doomcom.data[0] & 0x20) == 0) {
      if ((char)doomcom.data[0] < '\0') {
        fprintf((FILE *)debugfile,"%i/%i send %i = EXIT [%3i]",(ulong)(uint)gametic,
                (ulong)(uint)maketic,node,uVar12);
        if (0 < len) {
          uVar11 = 0;
          do {
            fprintf((FILE *)debugfile," %2x",(ulong)doomcom.data[uVar11]);
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
        }
      }
      else {
        uVar14 = (consoleplayer == Net_Arbitrator && NetMode == '\x01') | 2;
        uVar11 = 0xffffffff;
        if (0x3f < doomcom.data[0]) {
          bVar2 = doomcom.data[uVar14];
          uVar10 = maketic / ticdup;
          if (((uint)bVar2 - (uVar10 & 0xff)) + 0x40 < 0x81) {
            uVar10 = uVar10 & 0xffffff00;
          }
          else if ((int)((uint)bVar2 - (uVar10 & 0xff)) < 0x41) {
            uVar10 = (uVar10 & 0xffffff00) + 0x100;
          }
          else {
            uVar10 = (uVar10 & 0xffffff00) - 0x100;
          }
          uVar14 = uVar14 + 1;
          uVar11 = (ulong)(uVar10 + bVar2);
        }
        uVar10 = doomcom.data[0] & 3;
        if (uVar10 == 3) {
          uVar6 = (ulong)uVar14;
          uVar14 = uVar14 + 1;
          uVar10 = doomcom.data[uVar6] + 3;
        }
        uVar9 = (uint)doomcom.data[1];
        uVar4 = maketic / ticdup;
        if ((uVar9 - (uVar4 & 0xff)) + 0x40 < 0x81) {
          uVar4 = uVar4 & 0xffffff00;
        }
        else if ((int)(uVar9 - (uVar4 & 0xff)) < 0x41) {
          uVar4 = (uVar4 & 0xffffff00) + 0x100;
        }
        else {
          uVar4 = (uVar4 & 0xffffff00) - 0x100;
        }
        fprintf((FILE *)debugfile,"%i/%i send %i = (%i + %i, R %i) [%3i]",(ulong)(uint)gametic,
                (ulong)(uint)maketic,node,(ulong)(uVar4 + uVar9),(ulong)uVar10,uVar11,uVar12);
        if (0 < len) {
          uVar11 = 0;
          do {
            uVar7 = 0x20;
            if (uVar14 == uVar11) {
              uVar7 = 0x7c;
            }
            fprintf((FILE *)debugfile,"%c%2x",uVar7,(ulong)doomcom.data[uVar11]);
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
        }
      }
    }
    else {
      fprintf((FILE *)debugfile,"%i/%i send %i = SETUP [%3i]",(ulong)(uint)gametic,
              (ulong)(uint)maketic,node,uVar12);
      if (0 < len) {
        uVar11 = 0;
        do {
          fprintf((FILE *)debugfile," %2x",(ulong)doomcom.data[uVar11]);
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
    }
    fwrite(" [[ ",4,1,(FILE *)debugfile);
    if (0 < doomcom.numnodes) {
      piVar13 = nettics;
      lVar8 = 0;
      do {
        if (nodeingame[lVar8] == true) {
          fprintf((FILE *)debugfile,"%d ",(ulong)(uint)*piVar13);
        }
        else {
          fwrite("--- ",4,1,(FILE *)debugfile);
        }
        lVar8 = lVar8 + 1;
        piVar13 = (int *)((uint *)piVar13 + 1);
      } while (lVar8 < doomcom.numnodes);
    }
    fwrite("]]\n",3,1,(FILE *)debugfile);
  }
  if (node == 0) {
    memcpy(reboundstore,doomcom.data,(long)len);
    reboundpacket = len;
  }
  else if (demoplayback == false) {
    if (netgame == false) {
      I_Error("Tried to transmit to another node");
    }
    doomcom.command = 1;
    doomcom.remotenode = (SWORD)node;
    doomcom.datalength = (SWORD)len;
    if (net_fakelatency.Value < 2) {
      I_NetCmd();
    }
    else {
      memcpy(local_36f8,&doomcom,0x36c4);
      iVar5 = (*I_GetTime)(false);
      iVar3 = net_fakelatency.Value / 0x38;
      TArray<PacketStore,_PacketStore>::Grow(&OutBuffer,1);
      pPVar1 = OutBuffer.Array + OutBuffer.Count;
      pPVar1->timer = iVar3 + iVar5;
      memcpy(&pPVar1->message,local_36f8,0x36c4);
      OutBuffer.Count = OutBuffer.Count + 1;
    }
    if (OutBuffer.Count != 0) {
      uVar12 = 0;
      do {
        uVar10 = (uint)uVar12;
        iVar3 = OutBuffer.Array[uVar12].timer;
        iVar5 = (*I_GetTime)(false);
        uVar14 = uVar10;
        if (iVar3 <= iVar5) {
          memcpy(&doomcom,&OutBuffer.Array[uVar12].message,0x36c4);
          I_NetCmd();
          uVar14 = 0xffffffff;
          if (uVar10 < OutBuffer.Count) {
            OutBuffer.Count = OutBuffer.Count - 1;
            if (uVar10 <= OutBuffer.Count && OutBuffer.Count - uVar10 != 0) {
              memmove(OutBuffer.Array + uVar12,OutBuffer.Array + (uVar10 + 1),
                      (ulong)(OutBuffer.Count - uVar10) * 0x36c8);
            }
          }
        }
        uVar12 = (ulong)(uVar14 + 1);
      } while (uVar14 + 1 < OutBuffer.Count);
    }
  }
  return;
}

Assistant:

void HSendPacket (int node, int len)
{
	if (debugfile && node != 0)
	{
		int i, k, realretrans;

		if (netbuffer[0] & NCMD_SETUP)
		{
			fprintf (debugfile,"%i/%i send %i = SETUP [%3i]", gametic, maketic, node, len);
			for (i = 0; i < len; i++)
				fprintf (debugfile," %2x", ((BYTE *)netbuffer)[i]);
		}
		else if (netbuffer[0] & NCMD_EXIT)
		{
			fprintf (debugfile,"%i/%i send %i = EXIT [%3i]", gametic, maketic, node, len);
			for (i = 0; i < len; i++)
				fprintf (debugfile," %2x", ((BYTE *)netbuffer)[i]);
		}
		else
		{
			k = 2;

			if (NetMode == NET_PacketServer && consoleplayer == Net_Arbitrator &&
				node != 0)
			{
				k++;
			}

			if (netbuffer[0] & NCMD_RETRANSMIT)
				realretrans = ExpandTics (netbuffer[k++]);
			else
				realretrans = -1;

			int numtics = netbuffer[0] & 3;
			if (numtics == 3)
				numtics += netbuffer[k++];

			fprintf (debugfile,"%i/%i send %i = (%i + %i, R %i) [%3i]",
					gametic, maketic,
					node,
					ExpandTics(netbuffer[1]),
					numtics, realretrans, len);
			
			for (i = 0; i < len; i++)
				fprintf (debugfile, "%c%2x", i==k?'|':' ', ((BYTE *)netbuffer)[i]);
		}
		fprintf (debugfile, " [[ ");
		for (i = 0; i < doomcom.numnodes; ++i)
		{
			if (nodeingame[i])
			{
				fprintf (debugfile, "%d ", nettics[i]);
			}
			else
			{
				fprintf (debugfile, "--- ");
			}
		}
		fprintf (debugfile, "]]\n");
	}

	if (node == 0)
	{
		memcpy (reboundstore, netbuffer, len);
		reboundpacket = len;
		return;
	}

	if (demoplayback)
		return;

	if (!netgame)
		I_Error ("Tried to transmit to another node");

#if SIMULATEERRORS
	if (rand() < SIMULATEERRORS)
	{
		if (debugfile)
			fprintf (debugfile, "Drop!\n");
		return;
	}
#endif

	doomcom.command = CMD_SEND;
	doomcom.remotenode = node;
	doomcom.datalength = len;

#ifdef _DEBUG
	if (net_fakelatency / 2 > 0)
	{
		PacketStore store;
		store.message = doomcom;
		store.timer = I_GetTime(false) + ((net_fakelatency / 2) / (1000 / TICRATE));
		OutBuffer.Push(store);
	}
	else
		I_NetCmd();

	for (unsigned int i = 0; i < OutBuffer.Size(); i++)
	{
		if (OutBuffer[i].timer <= I_GetTime(false))
		{
			doomcom = OutBuffer[i].message;
			I_NetCmd();
			OutBuffer.Delete(i);
			i = -1;
		}
	}
#else
	I_NetCmd();
#endif
}